

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easing.cpp
# Opt level: O3

qreal easeInElastic_helper(qreal t,qreal b,qreal c,qreal d,qreal a,qreal p)

{
  double dVar1;
  double dVar2;
  undefined8 local_30;
  undefined8 local_28;
  
  if ((t != 0.0) || (NAN(t))) {
    if ((t != 1.0) || (NAN(t))) {
      if (ABS(c) <= d) {
        local_30 = asin(c / d);
        local_30 = local_30 * (a / 6.283185307179586);
        local_28 = d;
      }
      else {
        local_30 = a * 0.25;
        local_28 = c;
      }
      dVar1 = exp2((t + -1.0) * 10.0);
      dVar2 = sin((((t + -1.0) - local_30) * 6.283185307179586) / a);
      return b - dVar1 * local_28 * dVar2;
    }
    b = b + c;
  }
  return b;
}

Assistant:

static qreal easeInElastic_helper(qreal t, qreal b, qreal c, qreal d, qreal a, qreal p)
{
    if (t==0) return b;
    qreal t_adj = (qreal)t / (qreal)d;
    if (t_adj==1) return b+c;

    qreal s;
    if(a < ::qFabs(c)) {
        a = c;
        s = p / 4.0f;
    } else {
        s = p / (2 * M_PI) * ::qAsin(c / a);
    }

    t_adj -= 1.0f;
    return -(a*::qPow(2.0f,10*t_adj) * ::qSin( (t_adj*d-s)*(2*M_PI)/p )) + b;
}